

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateGetMemSize(char *pName)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  pcVar4 = strchr(pName,0x5f);
  pcVar5 = strchr(pcVar4 + 1,0x5f);
  iVar2 = atoi(pcVar4 + 1);
  uVar3 = atoi(pcVar5 + 1);
  uVar6 = uVar3;
  if (1 < uVar3) {
    uVar6 = uVar3 - 1;
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar6 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  if ((int)(uVar6 + iVar2) < 0x20) {
    return uVar3 << ((byte)iVar2 & 0x1f);
  }
  __assert_fail("Num1 + Abc_Base2Log(Num2) < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x6c4,"int Prs_CreateGetMemSize(char *)");
}

Assistant:

int Prs_CreateGetMemSize( char * pName )
{
    char * pPtr1 = strchr( pName, '_' );
    char * pPtr2 = strchr( pPtr1+1, '_' );
    int Num1 = atoi( pPtr1 + 1 );
    int Num2 = atoi( pPtr2 + 1 );
    assert( Num1 + Abc_Base2Log(Num2) < 32 );
    return (1 << Num1) * Num2;
}